

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O2

void __thiscall
helics::RandomDelayFilterOperation::setString
          (RandomDelayFilterOperation *this,string_view property,string_view val)

{
  bool bVar1;
  const_iterator cVar2;
  TimeRepresentation<count_time<9,_long>_> TVar3;
  utilities *this_00;
  char *pcVar4;
  char *pcVar5;
  string_view timeString;
  string_view timeString_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  string_view val_local;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  
  pcVar5 = val._M_str;
  this_00 = (utilities *)val._M_len;
  __y._M_str = "dist";
  __y._M_len = 4;
  val_local._M_len = (size_t)this_00;
  val_local._M_str = pcVar5;
  bVar1 = std::operator==(property,__y);
  if ((bVar1) ||
     (__y_00._M_str = "distribution", __y_00._M_len = 0xc, bVar1 = std::operator==(property,__y_00),
     bVar1)) {
    cVar2 = std::
            _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>_>
            ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>_>
                    *)distMap,&val_local);
    if (cVar2._M_node != (_Base_ptr)(distMap + 8)) {
      LOCK();
      (((this->rdelayGen)._M_t.
        super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
        ._M_t.
        super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
        .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->dist)._M_i =
           *(RandomDistributions *)&cVar2._M_node[1]._M_left;
      UNLOCK();
    }
    return;
  }
  __y_01._M_str = "param1";
  __y_01._M_len = 6;
  bVar1 = std::operator==(property,__y_01);
  pcVar4 = extraout_RDX;
  if ((!bVar1) &&
     (((__y_02._M_str = "mean", __y_02._M_len = 4, bVar1 = std::operator==(property,__y_02),
       pcVar4 = extraout_RDX_00, !bVar1 &&
       (__y_03._M_str = "min", __y_03._M_len = 3, bVar1 = std::operator==(property,__y_03),
       pcVar4 = extraout_RDX_01, !bVar1)) &&
      (__y_04._M_str = "alpha", __y_04._M_len = 5, bVar1 = std::operator==(property,__y_04),
      pcVar4 = extraout_RDX_02, !bVar1)))) {
    __y_05._M_str = "param2";
    __y_05._M_len = 6;
    bVar1 = std::operator==(property,__y_05);
    pcVar4 = extraout_RDX_03;
    if ((((!bVar1) &&
         (__y_06._M_str = "stddev", __y_06._M_len = 6, bVar1 = std::operator==(property,__y_06),
         pcVar4 = extraout_RDX_04, !bVar1)) &&
        (__y_07._M_str = "max", __y_07._M_len = 3, bVar1 = std::operator==(property,__y_07),
        pcVar4 = extraout_RDX_05, !bVar1)) &&
       (__y_08._M_str = "beta", __y_08._M_len = 4, bVar1 = std::operator==(property,__y_08),
       pcVar4 = extraout_RDX_06, !bVar1)) {
      return;
    }
    timeString_00._M_str = pcVar4;
    timeString_00._M_len = (size_t)pcVar5;
    TVar3 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                      (this_00,timeString_00);
    LOCK();
    (((this->rdelayGen)._M_t.
      super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
      ._M_t.
      super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
      .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->param2).
    super___atomic_float<double>._M_fp =
         (double)(TVar3.internalTimeCode % 1000000000) * 1e-09 +
         (double)(TVar3.internalTimeCode / 1000000000);
    UNLOCK();
    return;
  }
  timeString._M_str = pcVar4;
  timeString._M_len = (size_t)pcVar5;
  TVar3 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                    (this_00,timeString);
  LOCK();
  (((this->rdelayGen)._M_t.
    super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
    ._M_t.
    super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
    .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->param1).
  super___atomic_float<double>._M_fp =
       (double)(TVar3.internalTimeCode % 1000000000) * 1e-09 +
       (double)(TVar3.internalTimeCode / 1000000000);
  UNLOCK();
  return;
}

Assistant:

void RandomDelayFilterOperation::setString(std::string_view property, std::string_view val)
{
    if ((property == "dist") || (property == "distribution")) {
        auto res = distMap.find(val);
        if (res != distMap.end()) {
            rdelayGen->dist.store(res->second);
        }
    } else if ((property == "param1") || (property == "mean") || (property == "min") ||
               (property == "alpha")) {
        auto time = gmlc::utilities::loadTimeFromString<helics::Time>(val);
        rdelayGen->param1.store(static_cast<double>(time));
    } else if ((property == "param2") || (property == "stddev") || (property == "max") ||
               (property == "beta")) {
        auto time = gmlc::utilities::loadTimeFromString<helics::Time>(val);
        rdelayGen->param2.store(static_cast<double>(time));
    }
}